

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

XrResult ApiDumpLayerXrWaitFrame
                   (XrSession session,XrFrameWaitInfo *frameWaitInfo,XrFrameState *frameState)

{
  undefined8 gen_dispatch_table_00;
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  invalid_argument *this;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0 [32];
  ostringstream local_580 [8];
  ostringstream oss_frameState;
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8 [32];
  ostringstream local_398 [8];
  ostringstream oss_frameWaitInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  ostringstream local_200 [8];
  ostringstream oss_session;
  _Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false> local_80;
  _Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false> local_78;
  iterator map_iter;
  undefined1 local_60 [8];
  unique_lock<std::mutex> mlock;
  XrGeneratedDispatchTable *gen_dispatch_table;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  XrResult result;
  XrFrameState *frameState_local;
  XrFrameWaitInfo *frameWaitInfo_local;
  XrSession session_local;
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  frameWaitInfo_local = (XrFrameWaitInfo *)session;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&gen_dispatch_table);
  mlock._M_owns = false;
  mlock._9_7_ = 0;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_60,&g_session_dispatch_mutex);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<XrSession_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSession_T_*>,_std::equal_to<XrSession_T_*>,_std::allocator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::find(&g_session_dispatch_map,(key_type *)&frameWaitInfo_local);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<XrSession_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSession_T_*>,_std::equal_to<XrSession_T_*>,_std::allocator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::end(&g_session_dispatch_map);
  bVar1 = std::__detail::operator==(&local_78,&local_80);
  if (bVar1) {
    session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
                           *)&local_78);
    mlock._8_8_ = ppVar2->second;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
  if (!bVar1) {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[12],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [9])"XrResult",(char (*) [12])"xrWaitFrame",
               (char (*) [1])0x2ffb54);
    std::__cxx11::ostringstream::ostringstream(local_200);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_200,std::hex);
    std::ostream::operator<<(poVar3,frameWaitInfo_local);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],char_const(&)[8],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [10])"XrSession",(char (*) [8])"session",local_220);
    std::__cxx11::string::~string((string *)local_220);
    gen_dispatch_table_00 = mlock._8_8_;
    if (frameWaitInfo == (XrFrameWaitInfo *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_398);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_398,std::hex);
      std::ostream::operator<<(poVar3,(void *)0x0);
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[23],char_const(&)[14],std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&gen_dispatch_table,(char (*) [23])"const XrFrameWaitInfo*",
                 (char (*) [14])"frameWaitInfo",local_3b8);
      std::__cxx11::string::~string((string *)local_3b8);
      std::__cxx11::ostringstream::~ostringstream(local_398);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d8,"frameWaitInfo",&local_3d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_400,"const XrFrameWaitInfo*",&local_401);
      bVar1 = ApiDumpOutputXrStruct
                        ((XrGeneratedDispatchTable *)gen_dispatch_table_00,frameWaitInfo,
                         (string *)local_3d8,(string *)local_400,true,
                         (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&gen_dispatch_table);
      std::__cxx11::string::~string(local_400);
      std::allocator<char>::~allocator((allocator<char> *)&local_401);
      std::__cxx11::string::~string(local_3d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Invalid Operation");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_580);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_580,std::hex);
    std::ostream::operator<<(poVar3,frameState);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[14],char_const(&)[11],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [14])0x303ecb,(char (*) [11])"frameState",local_5a0)
    ;
    std::__cxx11::string::~string((string *)local_5a0);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_5b8,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gen_dispatch_table);
    ApiDumpLayerRecordContent(&local_5b8);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_5b8);
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (**(code **)(mlock._8_8_ + 0x108))(frameWaitInfo_local,frameWaitInfo,frameState);
    std::__cxx11::ostringstream::~ostringstream(local_580);
    std::__cxx11::ostringstream::~ostringstream(local_200);
    bVar1 = false;
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&gen_dispatch_table);
  if (bVar1 == false) {
    session_local._4_4_ =
         contents.
         super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return session_local._4_4_;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrWaitFrame(
    XrSession session,
    const XrFrameWaitInfo* frameWaitInfo,
    XrFrameState* frameState) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_session_dispatch_mutex);
            auto map_iter = g_session_dispatch_map.find(session);
            if (map_iter == g_session_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrWaitFrame", "");
        std::ostringstream oss_session;
        oss_session << std::hex << reinterpret_cast<const void*>(session);
        contents.emplace_back("XrSession", "session", oss_session.str());
        if (nullptr == frameWaitInfo) {
            std::ostringstream oss_frameWaitInfo;
            oss_frameWaitInfo << std::hex << reinterpret_cast<const void*>(frameWaitInfo);
            contents.emplace_back("const XrFrameWaitInfo*", "frameWaitInfo", oss_frameWaitInfo.str());
        } else if (!ApiDumpOutputXrStruct(gen_dispatch_table, frameWaitInfo, "frameWaitInfo", "const XrFrameWaitInfo*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_frameState;
        oss_frameState << std::hex << reinterpret_cast<const void*>(frameState);
        contents.emplace_back("XrFrameState*", "frameState", oss_frameState.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->WaitFrame(session, frameWaitInfo, frameState);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}